

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<capnp::compiler::LexedTokens::Builder&>
          (String *__return_storage_ptr__,kj *this,Builder *params)

{
  StructReader reader;
  char *pcVar1;
  size_t sVar2;
  Branch *pBVar3;
  StringTree local_78;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  capnp::_::StructBuilder::asReader((StructBuilder *)this);
  reader.capTable = (CapTableReader *)uStack_38;
  reader.segment = (SegmentReader *)local_40;
  reader.data = (void *)local_30;
  reader.pointers = (WirePointer *)uStack_28;
  reader.dataSize = (undefined4)local_20;
  reader.pointerCount = local_20._4_2_;
  reader._38_2_ = local_20._6_2_;
  reader._40_8_ = uStack_18;
  capnp::_::structString
            (&local_78,reader,(RawBrandedSchema *)(capnp::schemas::s_9e69a92512b19d18 + 0x48));
  _::concat<kj::StringTree>(__return_storage_ptr__,&local_78);
  sVar2 = local_78.branches.size_;
  pBVar3 = local_78.branches.ptr;
  if (local_78.branches.ptr != (Branch *)0x0) {
    local_78.branches.ptr = (Branch *)0x0;
    local_78.branches.size_ = 0;
    (**(local_78.branches.disposer)->_vptr_ArrayDisposer)
              (local_78.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar2 = local_78.text.content.size_;
  pcVar1 = local_78.text.content.ptr;
  if (local_78.text.content.ptr != (char *)0x0) {
    local_78.text.content.ptr = (char *)0x0;
    local_78.text.content.size_ = 0;
    (**(local_78.text.content.disposer)->_vptr_ArrayDisposer)
              (local_78.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}